

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

bool __thiscall
HighsPrimalHeuristics::linesearchRounding
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *point1,
          vector<double,_std::allocator<double>_> *point2,int solution_source)

{
  double dVar1;
  pointer piVar2;
  pointer piVar3;
  HighsMipSolver *pHVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var8;
  pointer pdVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  HighsInt i;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  vector<double,_std::allocator<double>_> roundedpoint;
  double local_b8;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar2 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)this->mipsolver->model_->num_col_);
  dVar17 = 0.0;
  do {
    pdVar9 = local_48._M_impl.super__Vector_impl_data._M_start;
    if (1.0 <= dVar17) {
      bVar11 = false;
      break;
    }
    pHVar4 = this->mipsolver;
    piVar5 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (point1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (point2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar10 = true;
    local_b8 = 1.0;
    for (uVar13 = 0; ((ulong)((long)piVar2 - (long)piVar3) >> 2 & 0xffffffff) != uVar13;
        uVar13 = uVar13 + 1) {
      lVar12 = (long)piVar5[uVar13];
      _Var8._M_head_impl =
           (pHVar4->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if (*(int *)(*(long *)&((_Var8._M_head_impl)->uplocks).
                             super__Vector_base<int,_std::allocator<int>_> + lVar12 * 4) == 0) {
        dVar16 = pdVar7[lVar12];
        if (pdVar7[lVar12] <= pdVar6[lVar12]) {
          dVar16 = pdVar6[lVar12];
        }
        dVar16 = ceil(dVar16 - (_Var8._M_head_impl)->feastol);
LAB_002dbab1:
        pdVar9[lVar12] = dVar16;
      }
      else {
        if (*(int *)(*(long *)&((_Var8._M_head_impl)->downlocks).
                               super__Vector_base<int,_std::allocator<int>_> + lVar12 * 4) == 0) {
          dVar16 = pdVar7[lVar12];
          if (pdVar6[lVar12] <= pdVar7[lVar12]) {
            dVar16 = pdVar6[lVar12];
          }
          dVar16 = floor(dVar16 + (_Var8._M_head_impl)->feastol);
          goto LAB_002dbab1;
        }
        dVar16 = pdVar7[lVar12];
        dVar1 = pdVar6[lVar12];
        dVar15 = floor(dVar16 + 0.5);
        dVar16 = floor(dVar1 * (1.0 - dVar17) + dVar17 * dVar16 + 0.5);
        pdVar9[lVar12] = dVar16;
        if ((dVar16 != dVar15) || (NAN(dVar16) || NAN(dVar15))) {
          dVar16 = ((dVar16 + 0.5 + (_Var8._M_head_impl)->feastol) - pdVar6[lVar12]) /
                   ABS(pdVar7[lVar12] - pdVar6[lVar12]);
          uVar14 = -(ulong)(dVar17 + 0.01 < dVar16);
          local_b8 = (double)(~-(ulong)(dVar16 < local_b8) & (ulong)local_b8 |
                             (~uVar14 & (ulong)local_b8 | uVar14 & (ulong)dVar16) &
                             -(ulong)(dVar16 < local_b8));
          bVar10 = false;
        }
      }
    }
    bVar11 = tryRoundedPoint(this,(vector<double,_std::allocator<double>_> *)&local_48,
                             solution_source);
    dVar17 = local_b8;
  } while (!bVar10 && !bVar11);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return bVar11;
}

Assistant:

bool HighsPrimalHeuristics::linesearchRounding(
    const std::vector<double>& point1, const std::vector<double>& point2,
    const int solution_source) {
  std::vector<double> roundedpoint;

  HighsInt numintcols = intcols.size();
  roundedpoint.resize(mipsolver.numCol());

  double alpha = 0.0;
  assert(int(mipsolver.mipdata_->uplocks.size()) == mipsolver.numCol());
  assert(int(point1.size()) == mipsolver.numCol());
  assert(int(point2.size()) == mipsolver.numCol());

  while (alpha < 1.0) {
    double nextalpha = 1.0;
    bool reachedpoint2 = true;
    // printf("trying alpha = %g\n", alpha);
    for (HighsInt i = 0; i != numintcols; ++i) {
      HighsInt col = intcols[i];
      assert(col >= 0);
      assert(col < mipsolver.numCol());
      if (mipsolver.mipdata_->uplocks[col] == 0) {
        roundedpoint[col] = std::ceil(std::max(point1[col], point2[col]) -
                                      mipsolver.mipdata_->feastol);
        continue;
      }

      if (mipsolver.mipdata_->downlocks[col] == 0) {
        roundedpoint[col] = std::floor(std::min(point1[col], point2[col]) +
                                       mipsolver.mipdata_->feastol);
        continue;
      }

      double convexcomb = (1.0 - alpha) * point1[col] + alpha * point2[col];
      double intpoint2 = std::floor(point2[col] + 0.5);
      roundedpoint[col] = std::floor(convexcomb + 0.5);

      if (roundedpoint[col] == intpoint2) continue;

      reachedpoint2 = false;
      double tmpalpha = (roundedpoint[col] + 0.5 + mipsolver.mipdata_->feastol -
                         point1[col]) /
                        std::abs(point2[col] - point1[col]);
      if (tmpalpha < nextalpha && tmpalpha > alpha + 1e-2) nextalpha = tmpalpha;
    }

    if (tryRoundedPoint(roundedpoint, solution_source)) return true;

    if (reachedpoint2) return false;

    alpha = nextalpha;
  }

  return false;
}